

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O1

void __thiscall EventQueue::Remove(EventQueue *this,Event *ev)

{
  iterator i;
  AutoLock _auto_lock_;
  Node *local_48;
  iterator local_40;
  AutoLock local_38;
  
  AutoLock::AutoLock(&local_38,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,0x92);
  local_48 = ((this->mQueue).mHead)->next;
  if (local_48 != (this->mQueue).mTail) {
    do {
      if (local_48->val == ev) {
        RefCount::Release(&local_48->val->super_RefCount);
        JetHead::list<Event_*>::iterator::erase(&local_40);
        local_48 = local_40.mNode;
        if (local_40.mNode != (Node *)0x0) {
          local_48 = (local_40.mNode)->prev;
        }
      }
      if (local_48 != (Node *)0x0) {
        local_48 = local_48->next;
      }
    } while (local_48 != (this->mQueue).mTail);
  }
  AutoLock::~AutoLock(&local_38);
  return;
}

Assistant:

void EventQueue::Remove( Event *ev )
{
	DebugAutoLock( mLock );

	for (JetHead::list<Event*>::iterator i = mQueue.begin(); i != mQueue.end(); ++i)
	{
		if ((*i) == ev)
		{
			(*i)->Release();
			i = i.erase();
			--i;
		}
	}	
}